

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono-test.cc
# Opt level: O2

void __thiscall ChronoTest_Locale_Test::TestBody(ChronoTest_Locale_Test *this)

{
  duration<long,_std::ratio<3600L,_1L>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char *message;
  seconds sec;
  AssertionResult gtest_ar;
  locale loc_5;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  tm time;
  locale loc;
  char *loc_name;
  
  std::locale::locale(&loc);
  std::locale::locale((locale *)&time,"ja_JP.utf8");
  std::locale::operator=(&loc,(locale *)&time);
  std::locale::~locale((locale *)&time);
  std::locale::locale((locale *)&sec,"ja_JP.utf8");
  time.tm_sec = 0;
  time.tm_min = 0;
  time.tm_zone = (char *)0x0;
  time.tm_isdst = 0;
  time._36_4_ = 0;
  time.tm_gmtoff = 0;
  time.tm_mon = 0;
  time.tm_year = 0;
  time.tm_wday = 0;
  time.tm_yday = 0;
  time.tm_hour = 0xe;
  time.tm_mday = 1;
  format_tm_abi_cxx11_(&local_98,&time,"%OH",(locale *)&sec);
  _loc_5 = 0xe;
  fmt::v5::format<char[7],std::chrono::duration<long,std::ratio<3600l,1l>>>
            (&local_78,(v5 *)&sec,(locale *)"{:%OH}",(char (*) [7])&loc_5,in_R8);
  pbVar1 = &local_78;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"format_tm(make_hour(14), \"%OH\", loc)",
             "fmt::format(loc, \"{:\" \"%OH\" \"}\", std::chrono::hours(14))",&local_98,pbVar1);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&time);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x144bb4;
    }
    else {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0xae,(char *)pbVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&time);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&time);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::locale::~locale((locale *)&sec);
  std::locale::locale((locale *)&sec,"ja_JP.utf8");
  time.tm_sec = 0;
  time.tm_min = 0;
  time.tm_isdst = 0;
  time._36_4_ = 0;
  time.tm_gmtoff = 0;
  time.tm_mon = 0;
  time.tm_year = 0;
  time.tm_wday = 0;
  time.tm_yday = 0;
  time.tm_zone = (char *)0x0;
  time.tm_hour = 0xe;
  time.tm_mday = 1;
  format_tm_abi_cxx11_(&local_98,&time,"%OI",(locale *)&sec);
  _loc_5 = 0xe;
  fmt::v5::format<char[7],std::chrono::duration<long,std::ratio<3600l,1l>>>
            (&local_78,(v5 *)&sec,(locale *)"{:%OI}",(char (*) [7])&loc_5,
             (duration<long,_std::ratio<3600L,_1L>_> *)pbVar1);
  pbVar1 = &local_78;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"format_tm(make_hour(14), \"%OI\", loc)",
             "fmt::format(loc, \"{:\" \"%OI\" \"}\", std::chrono::hours(14))",&local_98,pbVar1);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&time);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x144bb4;
    }
    else {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0xaf,(char *)pbVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&time);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&time);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::locale::~locale((locale *)&sec);
  std::locale::locale((locale *)&sec,"ja_JP.utf8");
  time.tm_zone = (char *)0x0;
  time.tm_isdst = 0;
  time._36_4_ = 0;
  time.tm_gmtoff = 0;
  time.tm_mon = 0;
  time.tm_year = 0;
  time.tm_wday = 0;
  time.tm_yday = 0;
  time.tm_hour = 0;
  time.tm_mday = 1;
  time.tm_sec = 0;
  time.tm_min = 0x2a;
  format_tm_abi_cxx11_(&local_98,&time,"%OM",(locale *)&sec);
  _loc_5 = 0x2a;
  fmt::v5::format<char[7],std::chrono::duration<long,std::ratio<60l,1l>>>
            (&local_78,(v5 *)&sec,(locale *)"{:%OM}",(char (*) [7])&loc_5,
             (duration<long,_std::ratio<60L,_1L>_> *)pbVar1);
  pbVar1 = &local_78;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"format_tm(make_minute(42), \"%OM\", loc)",
             "fmt::format(loc, \"{:\" \"%OM\" \"}\", std::chrono::minutes(42))",&local_98,pbVar1);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&time);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x144bb4;
    }
    else {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0xb0,(char *)pbVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&time);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&time);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::locale::~locale((locale *)&sec);
  std::locale::locale((locale *)&sec,"ja_JP.utf8");
  time.tm_zone = (char *)0x0;
  time.tm_isdst = 0;
  time._36_4_ = 0;
  time.tm_gmtoff = 0;
  time.tm_mon = 0;
  time.tm_year = 0;
  time.tm_wday = 0;
  time.tm_yday = 0;
  time.tm_hour = 0;
  time.tm_mday = 1;
  time.tm_sec = 0x2a;
  time.tm_min = 0;
  format_tm_abi_cxx11_(&local_98,&time,"%OS",(locale *)&sec);
  _loc_5 = 0x2a;
  fmt::v5::format<char[7],std::chrono::duration<long,std::ratio<1l,1l>>>
            (&local_78,(v5 *)&sec,(locale *)"{:%OS}",(char (*) [7])&loc_5,
             (duration<long,_std::ratio<1L,_1L>_> *)pbVar1);
  pbVar1 = &local_78;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"format_tm(make_second(42), \"%OS\", loc)",
             "fmt::format(loc, \"{:\" \"%OS\" \"}\", std::chrono::seconds(42))",&local_98,pbVar1);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&time);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x144bb4;
    }
    else {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0xb1,(char *)pbVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&time);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&time);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::locale::~locale((locale *)&sec);
  time.tm_isdst = 0;
  time._36_4_ = 0;
  time.tm_gmtoff = 0;
  time.tm_zone = (char *)0x0;
  time.tm_mon = 0;
  time.tm_year = 0;
  time.tm_wday = 0;
  time.tm_yday = 0;
  time.tm_sec = 0x2d;
  time.tm_min = 0x19;
  time.tm_hour = 3;
  time.tm_mday = 1;
  sec.__r = 0x3039;
  std::locale::locale(&loc_5,"ja_JP.utf8");
  format_tm_abi_cxx11_(&local_98,&time,"%r",&loc_5);
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
            (&local_78,(v5 *)&loc_5,(locale *)"{:%r}",(char (*) [6])&sec,
             (duration<long,_std::ratio<1L,_1L>_> *)pbVar1);
  pbVar1 = &local_78;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"format_tm(time, \"%r\", loc)",
             "fmt::format(loc, \"{:\" \"%r\" \"}\", sec)",&local_98,pbVar1);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x144bb4;
    }
    else {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0xb7,(char *)pbVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_98);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::locale::~locale(&loc_5);
  std::locale::locale(&loc_5,"ja_JP.utf8");
  format_tm_abi_cxx11_(&local_98,&time,"%p",&loc_5);
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
            (&local_78,(v5 *)&loc_5,(locale *)"{:%p}",(char (*) [6])&sec,
             (duration<long,_std::ratio<1L,_1L>_> *)pbVar1);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"format_tm(time, \"%p\", loc)",
             "fmt::format(loc, \"{:\" \"%p\" \"}\", sec)",&local_98,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0xb8,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_98);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::locale::~locale(&loc_5);
  std::locale::~locale(&loc);
  return;
}

Assistant:

TEST(ChronoTest, Locale) {
  const char *loc_name = "ja_JP.utf8";
  bool has_locale = false;
  std::locale loc;
  try {
    loc = std::locale(loc_name);
    has_locale = true;
  } catch (const std::runtime_error &) {}
  if (!has_locale) {
    fmt::print("{} locale is missing.\n", loc_name);
    return;
  }
  EXPECT_TIME("%OH", make_hour(14), std::chrono::hours(14));
  EXPECT_TIME("%OI", make_hour(14), std::chrono::hours(14));
  EXPECT_TIME("%OM", make_minute(42), std::chrono::minutes(42));
  EXPECT_TIME("%OS", make_second(42), std::chrono::seconds(42));
  auto time = make_tm();
  time.tm_hour = 3;
  time.tm_min = 25;
  time.tm_sec = 45;
  auto sec = std::chrono::seconds(12345);
  EXPECT_TIME("%r", time, sec);
  EXPECT_TIME("%p", time, sec);
}